

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

bool __thiscall FScanner::GetFloat(FScanner *this)

{
  bool bVar1;
  double dVar2;
  char *local_20;
  char *stopper;
  FScanner *this_local;
  
  stopper = (char *)this;
  CheckOpen(this);
  bVar1 = GetString(this);
  if (bVar1) {
    dVar2 = strtod(this->String,&local_20);
    this->Float = dVar2;
    if (*local_20 != '\0') {
      ScriptError(this,"SC_GetFloat: Bad numeric constant \"%s\".",this->String);
    }
    this->Number = (int)this->Float;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FScanner::GetFloat ()
{
	char *stopper;

	CheckOpen ();
	if (GetString())
	{
		Float = strtod (String, &stopper);
		if (*stopper != 0)
		{
			ScriptError ("SC_GetFloat: Bad numeric constant \"%s\".", String);
		}
		Number = (int)Float;
		return true;
	}
	else
	{
		return false;
	}
}